

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O1

void anon_unknown.dwarf_23d32::decrease_runners(void)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  lVar1 = (anonymous_namespace)::Shmem;
  if (iVar2 != 0) {
    die("lock failed");
  }
  if ((int)(anonymous_namespace)::Cores._128_4_ < *(int *)((anonymous_namespace)::Shmem + 0x148c)) {
    die("Shmem->Running <= Cores failed at line __LINE__");
  }
  *(int *)((anonymous_namespace)::Shmem + 0x148c) =
       *(int *)((anonymous_namespace)::Shmem + 0x148c) + -1;
  uVar3 = 99;
  do {
    uVar4 = (ulong)uVar3;
    iVar2 = *(int *)(lVar1 + 0x12f8 + uVar4 * 4);
    if (iVar2 != 0) {
      *(int *)(lVar1 + 0x12f8 + uVar4 * 4) = iVar2 + -1;
      iVar2 = pthread_cond_signal((pthread_cond_t *)(lVar1 + uVar4 * 0x30 + 0x38));
      if (iVar2 != 0) {
        die("pthread_cond_signal failed");
      }
      break;
    }
    bVar5 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar5);
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  if (iVar2 != 0) {
    die("unlock failed");
  }
  return;
}

Assistant:

void decrease_runners(void) {
  if (pthread_mutex_lock(&Shmem->Lock) != 0)
    die("lock failed");

  assert(Shmem->Running <= Cores);

  Shmem->Running--;
  // FIXME could cache the max depth, perhaps don't care
  for (int i = MAX_DEPTH - 1; i >= 0; --i) {
    if (Shmem->Waiting[i] != 0) {
      Shmem->Waiting[i]--;
      if (pthread_cond_signal(&Shmem->Cond[i]) != 0)
        die("pthread_cond_signal failed");
      break;
    }
  }

  if (pthread_mutex_unlock(&Shmem->Lock) != 0)
    die("unlock failed");
}